

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O3

callback_t *
end_property_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error
                  )

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  QTextStream *this_00;
  QByteArrayView QVar1;
  QTextStream *local_50;
  QString local_48;
  undefined4 local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  undefined8 local_18;
  
  std::vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>::
  push_back((anonymous_namespace)::current_class,
            (value_type *)&(anonymous_namespace)::current_property);
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_30 = 2;
    local_2c = 0;
    uStack_24 = 0;
    local_1c = 0;
    local_18 = parser()::category._8_8_;
    QMessageLogger::debug();
    this_00 = local_50;
    QVar1.m_data = (storage_type *)0x12;
    QVar1.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar1);
    QTextStream::operator<<(this_00,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_50[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_50,' ');
    }
    operator<<((QDebug *)&local_50,(string *)((anonymous_namespace)::current_property + 0x10));
    QDebug::~QDebug((QDebug *)&local_50);
  }
  this = DAT_001182f0;
  (anonymous_namespace)::current_property = 0;
  DAT_001182f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = class_state;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

callback_t end_property_state(MetaConfiguration &conf, std::ifstream &f,
                              int &error) {
  current_class->properties.push_back(current_property);
  qCDebug(parser) << "finishing property" << current_property->name;
  current_property = nullptr;
  return class_state;
}